

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TypedefDeclarationSyntax *pTVar1;
  Token TVar2;
  Token *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  Token *in_stack_00000020;
  BumpAllocator *in_stack_00000048;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000050;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *args_4;
  Token *args_3;
  
  args_3 = (Token *)__child_stack;
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000050,in_stack_00000048);
  TVar2 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  args_4 = (SyntaxList<slang::syntax::VariableDimensionSyntax> *)TVar2.info;
  not_null<slang::syntax::DataTypeSyntax_*>::operator*
            ((not_null<slang::syntax::DataTypeSyntax_*> *)0x77d6cb);
  deepClone<slang::syntax::DataTypeSyntax>
            ((DataTypeSyntax *)__child_stack,in_stack_ffffffffffffff98);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  deepClone<slang::syntax::VariableDimensionSyntax>
            ((SyntaxList<slang::syntax::VariableDimensionSyntax> *)in_stack_00000050,
             in_stack_00000048);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  pTVar1 = BumpAllocator::
           emplace<slang::syntax::TypedefDeclarationSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::DataTypeSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(DataTypeSyntax *)__fn,
                      args_3,args_4,in_stack_00000020);
  return (int)pTVar1;
}

Assistant:

static SyntaxNode* clone(const TypedefDeclarationSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<TypedefDeclarationSyntax>(
        *deepClone(node.attributes, alloc),
        node.typedefKeyword.deepClone(alloc),
        *deepClone<DataTypeSyntax>(*node.type, alloc),
        node.name.deepClone(alloc),
        *deepClone(node.dimensions, alloc),
        node.semi.deepClone(alloc)
    );
}